

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution_x86_avx512::forward_int8_x86
          (Convolution_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  int *piVar2;
  _func_int *p_Var3;
  Layer *pLVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Option OVar12;
  undefined4 uVar13;
  int i;
  uint uVar14;
  int iVar15;
  void *pvVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  void *pvVar22;
  pointer piVar23;
  undefined1 *puVar24;
  Convolution_x86_avx512 *pCVar25;
  uint uVar26;
  undefined8 *puVar27;
  long lVar28;
  uint uVar29;
  int i_1;
  ulong uVar30;
  int i_3;
  int iVar31;
  pointer piVar32;
  int iVar33;
  long lVar34;
  undefined1 *puVar35;
  int iVar36;
  undefined1 *puVar37;
  int outw;
  long lVar38;
  int iVar39;
  ulong uVar40;
  ulong uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [16];
  int w;
  int w_3;
  int w_2;
  Option opt_q;
  void *local_1e8;
  allocator_type local_1d9;
  void *local_1d8;
  void *local_1d0;
  pointer local_1c8;
  Mat *local_1c0;
  Convolution_x86_avx512 *local_1b8;
  pointer local_1b0;
  void *local_1a8;
  undefined1 *local_1a0;
  void *local_198;
  Mat *local_190;
  long local_188;
  Option *local_180;
  Mat local_178;
  void *local_130;
  undefined1 local_128 [32];
  Allocator *pAStack_108;
  undefined4 uStack_ec;
  size_t local_e8;
  Mat *local_e0;
  Mat local_d8;
  Mat *local_88;
  int local_80;
  int local_7c;
  Mat local_78;
  
  local_78.elempack = bottom_blob->elempack;
  local_78.elemsize = bottom_blob->elemsize;
  piVar2 = bottom_blob->refcount;
  local_78.data = bottom_blob->data;
  local_78.refcount = bottom_blob->refcount;
  local_78.allocator = bottom_blob->allocator;
  local_78.dims = bottom_blob->dims;
  local_78.w = bottom_blob->w;
  local_78.h = bottom_blob->h;
  local_78.d = bottom_blob->d;
  local_78.c = bottom_blob->c;
  local_78.cstep = bottom_blob->cstep;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + 1;
    UNLOCK();
  }
  local_1b8 = this;
  if (local_78.elempack == 0 || ((int)local_78.elemsize * 8) / local_78.elempack != 8) {
    auVar43 = vmovdqu64_avx512f((undefined1  [64])*opt);
    auVar43 = vmovdqu64_avx512f(auVar43);
    stack0xfffffffffffffee8 = auVar43._16_48_;
    local_128._0_8_ = auVar43._0_8_;
    local_128._8_8_ = opt->workspace_allocator;
    quantize_to_int8(bottom_blob,&local_78,
                     (Mat *)(&this->field_0x238 + (long)this->_vptr_Convolution_x86_avx512[-3]),
                     (Option *)local_128);
  }
  local_178.cstep = 0;
  local_178.data = (void *)0x0;
  local_178.refcount._0_4_ = 0;
  local_178.refcount._4_4_ = 0;
  local_178.elemsize = 0;
  local_178.elempack = 0;
  local_178.allocator = (Allocator *)0x0;
  local_178.dims = 0;
  local_178.w = 0;
  local_178.h = 0;
  local_178.d = 0;
  local_178.c = 0;
  Convolution::make_padding
            ((Convolution *)
             ((long)&local_1b8->_vptr_Convolution_x86_avx512 +
             (long)local_1b8->_vptr_Convolution_x86_avx512[-3]),&local_78,&local_178,opt);
  iVar31 = -100;
  if ((local_178.data == (void *)0x0) || (local_178.cstep * (long)local_178.c == 0))
  goto LAB_001d9712;
  p_Var3 = local_1b8->_vptr_Convolution_x86_avx512[-3];
  uVar1 = *(uint *)(p_Var3 + 0x30 + (long)&(local_1b8->weight_winograd23_data).data);
  iVar36 = (~((*(int *)(p_Var3 + 0x34 + (long)&(local_1b8->weight_winograd23_data).data) + -1) *
             *(int *)(p_Var3 + 0x3c + (long)&(local_1b8->weight_winograd23_data).data)) +
           local_178.w) / *(int *)(p_Var3 + 0x44 + (long)&(local_1b8->weight_winograd23_data).data)
           + 1;
  iVar33 = (~((*(int *)(p_Var3 + 0x38 + (long)&(local_1b8->weight_winograd23_data).data) + -1) *
             *(int *)(p_Var3 + 0x40 + (long)&(local_1b8->weight_winograd23_data).data)) +
           local_178.h) / *(int *)(p_Var3 + (long)&(local_1b8->weight_winograd43_data).data) + 1;
  iVar17 = *(int *)(p_Var3 + 0x20 + (long)&(local_1b8->weight_winograd43_data).data);
  uVar26 = 1;
  if (opt->use_packing_layout == true) {
    if (iVar17 < 0x65) {
      uVar26 = (uint)((uVar1 & 3) == 0) * 3 + 1;
    }
    else {
      uVar26 = 1;
      if ((uVar1 & 7) == 0) {
        uVar26 = 8;
      }
    }
  }
  local_198 = (void *)CONCAT44(local_198._4_4_,local_178.elempack);
  uVar14 = uVar26 * 4;
  if (100 < iVar17) {
    uVar14 = uVar26;
  }
  local_188 = (long)local_178.c;
  Mat::create(top_blob,iVar36,iVar33,(int)uVar1 / (int)uVar26,(ulong)uVar14,uVar26,
              opt->blob_allocator);
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_001d9712;
  local_190 = (Mat *)0x1;
  if (opt->use_packing_layout == true) {
    local_190 = (Mat *)(ulong)((uint)(((byte)(local_1b8->_vptr_Convolution_x86_avx512[-3] + 0x30)
                                             [(long)&(local_1b8->weight_winograd23_data).data] & 3)
                                     == 0) * 3 + 1);
  }
  local_d8.cstep = 0;
  local_d8.data = (void *)0x0;
  local_d8.refcount._0_4_ = 0;
  local_d8.refcount._4_4_ = 0;
  local_d8.elemsize = 0;
  local_d8.elempack = 0;
  local_d8.allocator = (Allocator *)0x0;
  local_d8.dims = 0;
  local_d8.w = 0;
  local_d8.h = 0;
  local_d8.d = 0;
  local_d8.c = 0;
  iVar31 = (int)local_190;
  local_180 = opt;
  local_88 = top_blob;
  local_7c = iVar17;
  Mat::create(&local_d8,iVar36,iVar33,
              *(int *)(local_1b8->_vptr_Convolution_x86_avx512[-3] + 0x30 +
                      (long)&(local_1b8->weight_winograd23_data).data) / iVar31,
              (ulong)(uint)(iVar31 * 4),iVar31,opt->workspace_allocator);
  iVar36 = local_d8.h;
  iVar33 = local_d8.w;
  OVar12 = _local_128;
  iVar17 = local_178.c;
  iVar31 = -100;
  if ((local_d8.data != (void *)0x0) &&
     (local_1c0 = (Mat *)(long)local_d8.c, local_d8.cstep * (long)local_1c0 != 0)) {
    iVar31 = (int)local_190;
    pCVar25 = local_1b8;
    iVar39 = (int)local_198;
    if (((int)local_198 == 8) && (iVar31 == 4)) {
      p_Var3 = local_1b8->_vptr_Convolution_x86_avx512[-3];
      uVar1 = *(uint *)(p_Var3 + 0x34 + (long)&(local_1b8->weight_winograd23_data).data);
      if (((ulong)uVar1 == 1) &&
         (*(int *)(p_Var3 + 0x38 + (long)&(local_1b8->weight_winograd23_data).data) == 1)) {
        if ((*(int *)(p_Var3 + 0x3c + (long)&(local_1b8->weight_winograd23_data).data) == 1) &&
           (((*(int *)(p_Var3 + 0x40 + (long)&(local_1b8->weight_winograd23_data).data) == 1 &&
             (*(int *)(p_Var3 + 0x44 + (long)&(local_1b8->weight_winograd23_data).data) == 1)) &&
            (*(int *)(p_Var3 + (long)&(local_1b8->weight_winograd43_data).data) == 1)))) {
          conv1x1s1_sgemm_pack8to4_int8_sse
                    (&local_178,&local_d8,&local_1b8->weight_sgemm_data,local_180);
        }
        else {
          if (((*(int *)(p_Var3 + 0x3c + (long)&(local_1b8->weight_winograd23_data).data) != 1) ||
              (*(int *)(p_Var3 + 0x40 + (long)&(local_1b8->weight_winograd23_data).data) != 1)) ||
             ((*(int *)(p_Var3 + 0x44 + (long)&(local_1b8->weight_winograd23_data).data) != 2 ||
              (*(int *)(p_Var3 + (long)&(local_1b8->weight_winograd43_data).data) != 2))))
          goto LAB_001d7c68;
          conv1x1s2_sgemm_pack8to4_int8_sse
                    (&local_178,&local_d8,&local_1b8->weight_sgemm_data,local_180);
        }
      }
      else {
LAB_001d7c68:
        if ((((local_180->use_winograd_convolution != true) || (uVar1 != 3)) ||
            (local_180->use_winograd43_convolution == false)) ||
           ((((*(int *)(p_Var3 + 0x38 + (long)&(local_1b8->weight_winograd23_data).data) != 3 ||
              (*(int *)(p_Var3 + 0x3c + (long)&(local_1b8->weight_winograd23_data).data) != 1)) ||
             (*(int *)(p_Var3 + 0x40 + (long)&(local_1b8->weight_winograd23_data).data) != 1)) ||
            ((*(int *)(p_Var3 + 0x44 + (long)&(local_1b8->weight_winograd23_data).data) != 1 ||
             (*(int *)(p_Var3 + (long)&(local_1b8->weight_winograd43_data).data) != 1)))))) {
          uVar26 = *(uint *)(p_Var3 + 0x38 + (long)&(local_1b8->weight_winograd23_data).data);
          local_1a0 = (undefined1 *)
                      (long)*(int *)(p_Var3 + 0x3c + (long)&(local_1b8->weight_winograd23_data).data
                                    );
          local_1c8 = (pointer)(long)*(int *)(p_Var3 + 0x40 +
                                             (long)&(local_1b8->weight_winograd23_data).data);
          iVar31 = *(int *)(p_Var3 + 0x44 + (long)&(local_1b8->weight_winograd23_data).data);
          local_1b0 = (pointer)(long)*(int *)(p_Var3 + (long)&(local_1b8->weight_winograd43_data).
                                                              data);
          local_1d8 = (void *)CONCAT44(local_1d8._4_4_,local_178.w);
          uVar30 = (ulong)(uint)local_178.c;
          puVar35 = (undefined1 *)(ulong)(uint)local_d8.w;
          pvVar22 = (void *)(ulong)(uint)local_d8.h;
          if (local_180->use_sgemm_convolution == true) {
            local_e8 = 0;
            local_128._0_28_ = ZEXT1228((undefined1  [12])0x0);
            uStack_ec = OVar12._60_4_;
            _local_128 = ZEXT3260(local_128);
            Mat::create((Mat *)local_128,local_d8.h * local_d8.w,uVar1 * uVar26,local_178.c,8,8,
                        local_180->workspace_allocator);
            local_1c0 = &local_1b8->weight_sgemm_data;
            if (0 < iVar17) {
              iVar17 = (int)local_1d8 * (int)local_1b0;
              local_1a8 = local_178.data;
              local_1b0 = (pointer)local_128._0_8_;
              local_1d0 = (void *)((long)local_178.w * (long)local_1c8);
              local_1e8 = (void *)0x0;
              do {
                if (0 < (int)uVar26) {
                  local_1d8 = (void *)(local_178.cstep * (long)local_1e8 * local_178.elemsize +
                                      (long)local_178.data);
                  piVar32 = (pointer)(local_128._0_8_ +
                                     local_e8 * (long)local_1e8 * local_128._16_8_);
                  local_1c8 = (pointer)(local_178.elemsize * (long)local_1d0);
                  uVar40 = 0;
                  do {
                    if (0 < (int)uVar1) {
                      uVar21 = 0;
                      do {
                        if (0 < iVar36) {
                          puVar27 = (undefined8 *)
                                    ((long)local_1d8 +
                                    uVar21 * (long)local_1a0 * 8 + (long)local_1c8 * uVar40);
                          uVar14 = 0;
                          do {
                            puVar24 = puVar35;
                            if (0 < iVar33) {
                              do {
                                *(undefined8 *)piVar32 = *puVar27;
                                piVar32 = piVar32 + 2;
                                puVar27 = puVar27 + iVar31;
                                uVar29 = (int)puVar24 - 1;
                                puVar24 = (undefined1 *)(ulong)uVar29;
                              } while (uVar29 != 0);
                            }
                            puVar27 = puVar27 + (iVar17 - iVar33 * iVar31);
                            uVar14 = uVar14 + 1;
                          } while (uVar14 != iVar36);
                        }
                        uVar21 = uVar21 + 1;
                      } while (uVar21 != uVar1);
                    }
                    uVar40 = uVar40 + 1;
                  } while (uVar40 != uVar26);
                }
                local_1e8 = (void *)((long)local_1e8 + 1);
              } while (local_1e8 != (void *)uVar30);
            }
            im2col_sgemm_pack8to4_int8_sse
                      ((Mat *)local_128,&local_d8,local_1c0,(Option *)local_180->workspace_allocator
                      );
            pCVar25 = local_1b8;
            iVar39 = (int)local_198;
            iVar31 = (int)local_190;
            if ((Allocator *)local_128._8_8_ != (Allocator *)0x0) {
              LOCK();
              *(int *)(_func_int ***)local_128._8_8_ = *(int *)(_func_int ***)local_128._8_8_ + -1;
              UNLOCK();
              if (*(int *)(_func_int ***)local_128._8_8_ == 0) {
                if (pAStack_108 == (Allocator *)0x0) {
                  if ((pointer)local_128._0_8_ != (pointer)0x0) {
                    free((void *)local_128._0_8_);
                  }
                }
                else {
                  (*pAStack_108->_vptr_Allocator[3])();
                }
              }
            }
          }
          else {
            uVar14 = uVar1 * uVar26;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)local_128,(long)(int)uVar14,&local_1d9);
            pCVar25 = local_1b8;
            if (0 < (int)uVar26) {
              iVar39 = 0;
              iVar15 = 0;
              uVar29 = 0;
              do {
                if (0 < (int)uVar1) {
                  lVar34 = 0;
                  do {
                    *(int *)(local_128._0_8_ + (iVar39 + lVar34) * 4) = iVar15;
                    iVar15 = iVar15 + (int)local_1a0;
                    lVar34 = lVar34 + 1;
                  } while (uVar1 != (uint)lVar34);
                  iVar39 = iVar39 + (uint)lVar34;
                }
                iVar15 = iVar15 + ((int)local_1d8 * (int)local_1c8 - (int)local_1a0 * uVar1);
                uVar29 = uVar29 + 1;
              } while (uVar29 != uVar26);
            }
            if (0 < (int)local_1c0) {
              local_1a8 = (void *)((long)iVar33 * 4);
              local_1e8 = (void *)0x0;
              do {
                if (0 < iVar36) {
                  local_1d8 = (void *)(local_d8.cstep * (long)local_1e8 * local_d8.elemsize +
                                      (long)local_d8.data);
                  local_1d0 = (void *)0x0;
                  do {
                    if (0 < iVar33) {
                      local_1c8 = (pointer)((long)local_1d0 * (long)local_1b0);
                      puVar24 = (undefined1 *)0x0;
                      do {
                        local_1a0 = puVar24;
                        if (iVar17 < 1) {
                          auVar50 = (undefined1  [16])0x0;
                          auVar42 = (undefined1  [16])0x0;
                          auVar47 = (undefined1  [16])0x0;
                          auVar44 = (undefined1  [16])0x0;
                        }
                        else {
                          pvVar16 = (void *)((local_1b8->weight_data_tm).cstep * (long)local_1e8 *
                                             (local_1b8->weight_data_tm).elemsize +
                                            (long)(local_1b8->weight_data_tm).data);
                          auVar43 = ZEXT1664((undefined1  [16])0x0);
                          uVar40 = 0;
                          auVar49 = ZEXT1664((undefined1  [16])0x0);
                          auVar48 = ZEXT1664((undefined1  [16])0x0);
                          auVar46 = ZEXT1664((undefined1  [16])0x0);
                          do {
                            if (0 < (int)uVar14) {
                              lVar34 = 0;
                              do {
                                auVar50._8_8_ = 0;
                                auVar50._0_8_ =
                                     *(ulong *)((long)local_178.data +
                                               (long)*(int *)(local_128._0_8_ + lVar34) * 8 +
                                               local_178.cstep * local_178.elemsize * uVar40 +
                                               (long)(iVar31 * 8 * (int)local_1a0) +
                                               (long)local_178.w * (long)local_1c8 *
                                               local_178.elemsize);
                                auVar44 = vpcmpgtb_avx((undefined1  [16])0x0,auVar50);
                                auVar11 = vpunpcklbw_avx(auVar50,auVar44);
                                auVar44 = *(undefined1 (*) [16])((long)pvVar16 + lVar34 * 8);
                                auVar50 = *(undefined1 (*) [16])((long)pvVar16 + lVar34 * 8 + 0x10);
                                auVar42 = vpcmpgtb_avx((undefined1  [16])0x0,auVar44);
                                auVar47 = vpcmpgtb_avx((undefined1  [16])0x0,auVar50);
                                auVar45 = vpunpcklbw_avx(auVar44,auVar42);
                                auVar44 = vpunpckhbw_avx(auVar44,auVar42);
                                auVar42 = vpunpcklbw_avx(auVar50,auVar47);
                                auVar50 = vpunpckhbw_avx(auVar50,auVar47);
                                auVar7 = vpmullw_avx(auVar45,auVar11);
                                auVar45 = vpmulhw_avx(auVar45,auVar11);
                                auVar8 = vpmullw_avx(auVar11,auVar44);
                                auVar5 = vpmulhw_avx(auVar11,auVar44);
                                auVar9 = vpmullw_avx(auVar42,auVar11);
                                auVar6 = vpmulhw_avx(auVar42,auVar11);
                                auVar10 = vpmullw_avx(auVar11,auVar50);
                                auVar11 = vpmulhw_avx(auVar11,auVar50);
                                auVar44 = vpunpcklwd_avx(auVar7,auVar45);
                                auVar44 = vpaddd_avx(auVar43._0_16_,auVar44);
                                auVar50 = vpunpcklwd_avx(auVar8,auVar5);
                                auVar50 = vpaddd_avx(auVar49._0_16_,auVar50);
                                auVar42 = vpunpcklwd_avx(auVar9,auVar6);
                                auVar42 = vpaddd_avx(auVar48._0_16_,auVar42);
                                auVar47 = vpunpcklwd_avx(auVar10,auVar11);
                                auVar47 = vpaddd_avx(auVar46._0_16_,auVar47);
                                auVar45 = vpunpckhwd_avx(auVar7,auVar45);
                                auVar44 = vpaddd_avx(auVar44,auVar45);
                                auVar43 = ZEXT1664(auVar44);
                                auVar44 = vpunpckhwd_avx(auVar8,auVar5);
                                auVar44 = vpaddd_avx(auVar50,auVar44);
                                auVar49 = ZEXT1664(auVar44);
                                auVar44 = vpunpckhwd_avx(auVar9,auVar6);
                                auVar44 = vpaddd_avx(auVar42,auVar44);
                                auVar48 = ZEXT1664(auVar44);
                                auVar44 = vpunpckhwd_avx(auVar10,auVar11);
                                auVar44 = vpaddd_avx(auVar47,auVar44);
                                auVar46 = ZEXT1664(auVar44);
                                lVar34 = lVar34 + 4;
                              } while ((ulong)uVar14 << 2 != lVar34);
                              pvVar16 = (void *)((long)pvVar16 + (ulong)(uVar14 - 1) * 0x20 + 0x20);
                            }
                            auVar42 = auVar48._0_16_;
                            auVar50 = auVar46._0_16_;
                            auVar47 = auVar49._0_16_;
                            auVar44 = auVar43._0_16_;
                            uVar40 = uVar40 + 1;
                          } while (uVar40 != uVar30);
                        }
                        auVar45 = vpunpckldq_avx(auVar44,auVar47);
                        auVar5 = vpunpckldq_avx(auVar42,auVar50);
                        auVar47 = vpunpckhdq_avx(auVar44,auVar47);
                        auVar50 = vpunpckhdq_avx(auVar42,auVar50);
                        auVar42 = vpunpcklqdq_avx(auVar45,auVar5);
                        auVar44 = vpunpckhqdq_avx(auVar45,auVar5);
                        auVar44 = vpaddd_avx(auVar42,auVar44);
                        auVar42 = vpunpcklqdq_avx(auVar47,auVar50);
                        auVar50 = vpunpckhqdq_avx(auVar47,auVar50);
                        auVar50 = vpaddd_avx(auVar50,auVar42);
                        auVar44 = vpaddd_avx(auVar44,auVar50);
                        *(undefined1 (*) [16])((long)local_1d8 + (long)local_1a0 * 0x10) = auVar44;
                        puVar24 = local_1a0 + 1;
                      } while (local_1a0 + 1 != puVar35);
                    }
                    local_1d8 = (void *)((long)local_1d8 + (long)iVar33 * 0x10);
                    local_1d0 = (void *)((long)local_1d0 + 1);
                  } while (local_1d0 != pvVar22);
                }
                local_1e8 = (void *)((long)local_1e8 + 1);
              } while ((Mat *)local_1e8 != local_1c0);
            }
            iVar39 = (int)local_198;
            iVar31 = (int)local_190;
            if ((pointer)local_128._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
            }
          }
          goto LAB_001d8249;
        }
        conv3x3s1_winograd43_pack8to4_int8_sse
                  (&local_178,&local_d8,&local_1b8->weight_winograd43_data,local_180);
      }
    }
    else {
LAB_001d8249:
      iVar36 = local_d8.h;
      iVar33 = local_d8.w;
      OVar12 = _local_128;
      iVar17 = local_178.c;
      if ((iVar39 == 1) && (iVar31 == 4)) {
        p_Var3 = pCVar25->_vptr_Convolution_x86_avx512[-3];
        uVar1 = *(uint *)(p_Var3 + 0x34 + (long)&(pCVar25->weight_winograd23_data).data);
        puVar35 = (undefined1 *)(ulong)uVar1;
        if (puVar35 == (undefined1 *)0x7) {
          if ((((*(int *)(p_Var3 + 0x38 + (long)&(pCVar25->weight_winograd23_data).data) != 7) ||
               (*(int *)(p_Var3 + 0x3c + (long)&(pCVar25->weight_winograd23_data).data) != 1)) ||
              (*(int *)(p_Var3 + 0x40 + (long)&(pCVar25->weight_winograd23_data).data) != 1)) ||
             ((*(int *)(p_Var3 + 0x44 + (long)&(pCVar25->weight_winograd23_data).data) != 2 ||
              (*(int *)(p_Var3 + (long)&(pCVar25->weight_winograd43_data).data) != 2))))
          goto LAB_001d8446;
          conv7x7s2_pack1to4_int8_sse(&local_178,&local_d8,&pCVar25->weight_sgemm_data,local_180);
        }
        else if (uVar1 == 3) {
          if (*(int *)(p_Var3 + 0x38 + (long)&(pCVar25->weight_winograd23_data).data) != 3)
          goto LAB_001d8446;
          if (((*(int *)(p_Var3 + 0x3c + (long)&(pCVar25->weight_winograd23_data).data) == 1) &&
              (*(int *)(p_Var3 + 0x40 + (long)&(pCVar25->weight_winograd23_data).data) == 1)) &&
             ((*(int *)(p_Var3 + 0x44 + (long)&(pCVar25->weight_winograd23_data).data) == 1 &&
              (*(int *)(p_Var3 + (long)&(pCVar25->weight_winograd43_data).data) == 1)))) {
            conv3x3s1_pack1to4_int8_sse(&local_178,&local_d8,&pCVar25->weight_sgemm_data,local_180);
          }
          else {
            if ((((*(int *)(p_Var3 + 0x3c + (long)&(pCVar25->weight_winograd23_data).data) != 1) ||
                 (*(int *)(p_Var3 + 0x40 + (long)&(pCVar25->weight_winograd23_data).data) != 1)) ||
                (*(int *)(p_Var3 + 0x44 + (long)&(pCVar25->weight_winograd23_data).data) != 2)) ||
               (*(int *)(p_Var3 + (long)&(pCVar25->weight_winograd43_data).data) != 2))
            goto LAB_001d8446;
            conv3x3s2_pack1to4_int8_sse(&local_178,&local_d8,&pCVar25->weight_sgemm_data,local_180);
          }
        }
        else {
          if ((uVar1 != 1) ||
             (*(int *)(p_Var3 + 0x38 + (long)&(pCVar25->weight_winograd23_data).data) != 1)) {
LAB_001d8446:
            local_1d0 = (void *)(ulong)*(uint *)(p_Var3 + 0x38 +
                                                (long)&(pCVar25->weight_winograd23_data).data);
            local_1c8 = (pointer)(long)*(int *)(p_Var3 + 0x3c +
                                               (long)&(pCVar25->weight_winograd23_data).data);
            local_130 = (void *)(long)*(int *)(p_Var3 + 0x40 +
                                              (long)&(pCVar25->weight_winograd23_data).data);
            iVar31 = *(int *)(p_Var3 + 0x44 + (long)&(pCVar25->weight_winograd23_data).data);
            lVar34 = (long)iVar31;
            local_1b0 = (pointer)(long)*(int *)(p_Var3 + (long)&(pCVar25->weight_winograd43_data).
                                                                data);
            local_1d8 = (void *)CONCAT44(local_1d8._4_4_,local_178.w);
            puVar37 = (undefined1 *)(ulong)(uint)local_178.c;
            puVar24 = (undefined1 *)(long)local_d8.w;
            pvVar22 = (void *)(ulong)(uint)local_d8.h;
            uVar26 = *(uint *)(p_Var3 + 0x38 + (long)&(pCVar25->weight_winograd23_data).data) *
                     uVar1;
            if (local_180->use_sgemm_convolution == true) {
              local_e8 = 0;
              local_128._0_28_ = ZEXT1228((undefined1  [12])0x0);
              uStack_ec = OVar12._60_4_;
              _local_128 = ZEXT3260(local_128);
              Mat::create((Mat *)local_128,local_d8.h * local_d8.w,uVar26,local_178.c,1,1,
                          local_180->workspace_allocator);
              local_e0 = &local_1b8->weight_sgemm_data;
              if (0 < iVar17) {
                iVar17 = (int)local_1d8 * (int)local_1b0;
                local_1c0 = (Mat *)0x0;
                do {
                  if (0 < (int)local_1d0) {
                    local_1a8 = (void *)(local_178.cstep * (long)local_1c0 * local_178.elemsize +
                                        (long)local_178.data);
                    piVar32 = (pointer)(local_e8 * (long)local_1c0 * local_128._16_8_ +
                                       local_128._0_8_);
                    local_1b0 = (pointer)((long)local_178.w * local_178.elemsize * (long)local_130);
                    pvVar22 = (void *)0x0;
                    do {
                      if (0 < (int)uVar1) {
                        local_1d8 = (void *)((long)local_1b0 * (long)pvVar22 + (long)local_1a8);
                        lVar38 = 0;
                        do {
                          if (0 < iVar36) {
                            puVar24 = (undefined1 *)(lVar38 * (long)local_1c8 + (long)local_1d8);
                            uVar26 = 0;
                            do {
                              if (iVar33 < 4) {
                                uVar14 = 0;
                              }
                              else {
                                iVar39 = 3;
                                do {
                                  *(undefined1 *)piVar32 = *puVar24;
                                  *(undefined1 *)((long)piVar32 + 1) = puVar24[lVar34];
                                  *(undefined1 *)((long)piVar32 + 2) = puVar24[iVar31 * 2];
                                  *(undefined1 *)((long)piVar32 + 3) = puVar24[iVar31 * 3];
                                  puVar24 = puVar24 + lVar34 * 4;
                                  piVar32 = piVar32 + 1;
                                  iVar39 = iVar39 + 4;
                                  uVar14 = iVar33 & 0xfffffffc;
                                } while (iVar39 < iVar33);
                              }
                              uVar29 = uVar14 | 1;
                              while ((int)uVar29 < iVar33) {
                                *(undefined1 *)piVar32 = *puVar24;
                                *(undefined1 *)((long)piVar32 + 1) = puVar24[lVar34];
                                puVar24 = puVar24 + iVar31 * 2;
                                piVar32 = (pointer)((long)piVar32 + 2);
                                uVar29 = uVar14 + 3;
                                uVar14 = uVar14 + 2;
                              }
                              if ((int)uVar14 < iVar33) {
                                iVar39 = iVar33 - uVar14;
                                do {
                                  *(undefined1 *)piVar32 = *puVar24;
                                  puVar24 = puVar24 + lVar34;
                                  piVar32 = (pointer)((long)piVar32 + 1);
                                  iVar39 = iVar39 + -1;
                                } while (iVar39 != 0);
                              }
                              puVar24 = puVar24 + (iVar17 - iVar33 * iVar31);
                              uVar26 = uVar26 + 1;
                            } while (uVar26 != iVar36);
                          }
                          lVar38 = lVar38 + 1;
                        } while ((undefined1 *)lVar38 != puVar35);
                      }
                      pvVar22 = (void *)((long)pvVar22 + 1);
                    } while (pvVar22 != local_1d0);
                  }
                  local_1c0 = (Mat *)((long)&local_1c0->data + 1);
                  local_1a0 = puVar35;
                } while (local_1c0 != (Mat *)puVar37);
              }
              im2col_sgemm_pack1to4_int8_sse
                        ((Mat *)local_128,&local_d8,local_e0,
                         (Option *)local_180->workspace_allocator);
              pCVar25 = local_1b8;
              iVar39 = (int)local_198;
              iVar31 = (int)local_190;
              if ((Allocator *)local_128._8_8_ != (Allocator *)0x0) {
                LOCK();
                *(int *)(_func_int ***)local_128._8_8_ = *(int *)(_func_int ***)local_128._8_8_ + -1
                ;
                UNLOCK();
                if (*(int *)(_func_int ***)local_128._8_8_ == 0) {
                  if (pAStack_108 == (Allocator *)0x0) {
                    if ((pointer)local_128._0_8_ != (pointer)0x0) {
                      free((void *)local_128._0_8_);
                    }
                  }
                  else {
                    (*pAStack_108->_vptr_Allocator[3])();
                  }
                }
              }
            }
            else {
              local_1c0 = (Mat *)(ulong)(uint)local_d8.c;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)local_128,(long)(int)uVar26,&local_1d9
                        );
              pCVar25 = local_1b8;
              if (0 < (int)local_1d0) {
                iVar31 = 0;
                iVar39 = 0;
                iVar15 = 0;
                do {
                  if (0 < (int)uVar1) {
                    lVar34 = 0;
                    do {
                      *(int *)(local_128._0_8_ + (iVar31 + lVar34) * 4) = iVar39;
                      iVar39 = iVar39 + (int)local_1c8;
                      lVar34 = lVar34 + 1;
                    } while (uVar1 != (uint)lVar34);
                    iVar31 = iVar31 + (uint)lVar34;
                  }
                  iVar39 = iVar39 + ((int)local_1d8 * (int)local_130 - (int)local_1c8 * uVar1);
                  iVar15 = iVar15 + 1;
                } while (iVar15 != (int)local_1d0);
              }
              if (0 < (int)local_1c0) {
                local_1a8 = (void *)((long)puVar24 * 4);
                local_1e8 = (void *)0x0;
                do {
                  if (0 < iVar36) {
                    local_1d8 = (void *)(local_d8.cstep * (long)local_1e8 * local_d8.elemsize +
                                        (long)local_d8.data);
                    local_1d0 = (void *)0x0;
                    do {
                      if (0 < iVar33) {
                        local_1c8 = (pointer)((long)local_1d0 * (long)local_1b0);
                        puVar35 = (undefined1 *)0x0;
                        do {
                          local_1a0 = puVar35;
                          if (iVar17 < 1) {
                            auVar44 = (undefined1  [16])0x0;
                          }
                          else {
                            pvVar16 = (void *)((local_1b8->weight_data_tm).cstep * (long)local_1e8 *
                                               (local_1b8->weight_data_tm).elemsize +
                                              (long)(local_1b8->weight_data_tm).data);
                            auVar43 = ZEXT1664((undefined1  [16])0x0);
                            lVar34 = 0;
                            do {
                              if (0 < (int)uVar26) {
                                uVar30 = 0;
                                do {
                                  auVar42 = vpbroadcastw_avx512vl();
                                  auVar47._8_8_ = 0;
                                  auVar47._0_8_ = *(ulong *)((long)pvVar16 + uVar30 * 4);
                                  auVar44 = vpcmpgtb_avx((undefined1  [16])0x0,auVar47);
                                  auVar44 = vpunpcklbw_avx(auVar47,auVar44);
                                  auVar50 = vpmullw_avx(auVar42,auVar44);
                                  auVar44 = vpmulhw_avx(auVar42,auVar44);
                                  auVar44 = vpunpcklwd_avx(auVar50,auVar44);
                                  auVar44 = vpaddd_avx(auVar43._0_16_,auVar44);
                                  auVar43 = ZEXT1664(auVar44);
                                  uVar30 = uVar30 + 1;
                                } while (uVar26 != uVar30);
                                pvVar16 = (void *)((long)pvVar16 + (ulong)(uVar26 - 1) * 4 + 4);
                              }
                              auVar44 = auVar43._0_16_;
                              lVar34 = lVar34 + 1;
                            } while ((undefined1 *)lVar34 != puVar37);
                          }
                          *(undefined1 (*) [16])((long)local_1d8 + (long)local_1a0 * 0x10) = auVar44
                          ;
                          puVar35 = local_1a0 + 1;
                        } while (local_1a0 + 1 != puVar24);
                      }
                      local_1d8 = (void *)((long)local_1d8 + (long)puVar24 * 0x10);
                      local_1d0 = (void *)((long)local_1d0 + 1);
                    } while (local_1d0 != pvVar22);
                  }
                  local_1e8 = (void *)((long)local_1e8 + 1);
                } while ((Mat *)local_1e8 != local_1c0);
              }
              iVar39 = (int)local_198;
              iVar31 = (int)local_190;
              if ((pointer)local_128._0_8_ != (pointer)0x0) {
                operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
              }
            }
            goto LAB_001d89a3;
          }
          if (((*(int *)(p_Var3 + 0x3c + (long)&(pCVar25->weight_winograd23_data).data) == 1) &&
              ((*(int *)(p_Var3 + 0x40 + (long)&(pCVar25->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var3 + 0x44 + (long)&(pCVar25->weight_winograd23_data).data) == 1)))) &&
             (*(int *)(p_Var3 + (long)&(pCVar25->weight_winograd43_data).data) == 1)) {
            conv1x1s1_sgemm_pack1to4_int8_sse
                      (&local_178,&local_d8,&pCVar25->weight_sgemm_data,local_180);
          }
          else {
            if ((((*(int *)(p_Var3 + 0x3c + (long)&(pCVar25->weight_winograd23_data).data) != 1) ||
                 (*(int *)(p_Var3 + 0x40 + (long)&(pCVar25->weight_winograd23_data).data) != 1)) ||
                (*(int *)(p_Var3 + 0x44 + (long)&(pCVar25->weight_winograd23_data).data) != 2)) ||
               (*(int *)(p_Var3 + (long)&(pCVar25->weight_winograd43_data).data) != 2))
            goto LAB_001d8446;
            conv1x1s2_sgemm_pack1to4_int8_sse
                      (&local_178,&local_d8,&pCVar25->weight_sgemm_data,local_180);
          }
        }
      }
      else {
LAB_001d89a3:
        iVar33 = local_d8.w;
        iVar17 = local_178.c;
        uVar13 = uStack_ec;
        if ((iVar39 == 8) && (iVar31 == 1)) {
          p_Var3 = pCVar25->_vptr_Convolution_x86_avx512[-3];
          uVar1 = *(uint *)(p_Var3 + 0x34 + (long)&(pCVar25->weight_winograd23_data).data);
          if (((ulong)uVar1 == 1) &&
             (*(int *)(p_Var3 + 0x38 + (long)&(pCVar25->weight_winograd23_data).data) == 1)) {
            if ((*(int *)(p_Var3 + 0x3c + (long)&(pCVar25->weight_winograd23_data).data) == 1) &&
               (((*(int *)(p_Var3 + 0x40 + (long)&(pCVar25->weight_winograd23_data).data) == 1 &&
                 (*(int *)(p_Var3 + 0x44 + (long)&(pCVar25->weight_winograd23_data).data) == 1)) &&
                (*(int *)(p_Var3 + (long)&(pCVar25->weight_winograd43_data).data) == 1)))) {
              conv1x1s1_sgemm_pack8to1_int8_sse
                        (&local_178,&local_d8,&pCVar25->weight_sgemm_data,local_180);
            }
            else {
              if ((((*(int *)(p_Var3 + 0x3c + (long)&(pCVar25->weight_winograd23_data).data) != 1)
                   || (*(int *)(p_Var3 + 0x40 + (long)&(pCVar25->weight_winograd23_data).data) != 1)
                   ) || (*(int *)(p_Var3 + 0x44 + (long)&(pCVar25->weight_winograd23_data).data) !=
                         2)) ||
                 (*(int *)(p_Var3 + (long)&(pCVar25->weight_winograd43_data).data) != 2))
              goto LAB_001d8b15;
              conv1x1s2_sgemm_pack8to1_int8_sse
                        (&local_178,&local_d8,&pCVar25->weight_sgemm_data,local_180);
            }
          }
          else {
LAB_001d8b15:
            if (((local_180->use_winograd_convolution == true) && (uVar1 == 3)) &&
               ((local_180->use_winograd43_convolution != false &&
                ((((*(int *)(p_Var3 + 0x38 + (long)&(pCVar25->weight_winograd23_data).data) == 3 &&
                   (*(int *)(p_Var3 + 0x3c + (long)&(pCVar25->weight_winograd23_data).data) == 1))
                  && (*(int *)(p_Var3 + 0x40 + (long)&(pCVar25->weight_winograd23_data).data) == 1))
                 && ((*(int *)(p_Var3 + 0x44 + (long)&(pCVar25->weight_winograd23_data).data) == 1
                     && (*(int *)(p_Var3 + (long)&(pCVar25->weight_winograd43_data).data) == 1))))))
               )) {
              conv3x3s1_winograd43_pack8to1_int8_sse
                        (&local_178,&local_d8,&pCVar25->weight_winograd43_data,local_180);
            }
            else {
              local_1d8 = (void *)(ulong)*(uint *)(p_Var3 + 0x38 +
                                                  (long)&(pCVar25->weight_winograd23_data).data);
              iVar31 = *(int *)(p_Var3 + 0x3c + (long)&(pCVar25->weight_winograd23_data).data);
              iVar36 = *(int *)(p_Var3 + 0x40 + (long)&(pCVar25->weight_winograd23_data).data);
              iVar39 = *(int *)(p_Var3 + 0x44 + (long)&(pCVar25->weight_winograd23_data).data);
              local_198 = (void *)(long)*(int *)(p_Var3 + (long)&(pCVar25->weight_winograd43_data).
                                                                 data);
              local_1c8 = (pointer)CONCAT44(local_1c8._4_4_,local_178.w);
              uVar30 = (ulong)(uint)local_178.c;
              uVar40 = (ulong)(uint)local_d8.w;
              local_1a0 = (undefined1 *)(ulong)(uint)local_d8.h;
              uVar26 = *(uint *)(p_Var3 + 0x38 + (long)&(pCVar25->weight_winograd23_data).data) *
                       uVar1;
              if (local_180->use_sgemm_convolution == true) {
                local_e8 = 0;
                local_128._0_28_ = ZEXT1228((undefined1  [12])0x0);
                _local_128 = ZEXT3260(local_128);
                _local_128 = (Option)CONCAT460(uVar13,_local_128);
                Mat::create((Mat *)local_128,local_d8.h * local_d8.w,uVar26,local_178.c,8,8,
                            local_180->workspace_allocator);
                local_1c0 = &local_1b8->weight_sgemm_data;
                if (0 < iVar17) {
                  iVar17 = (int)local_1c8 * (int)local_198;
                  local_1a8 = local_178.data;
                  local_1b0 = (pointer)local_128._0_8_;
                  local_1d0 = (void *)((long)local_178.w * (long)iVar36);
                  local_1e8 = (void *)0x0;
                  do {
                    if (0 < (int)local_1d8) {
                      piVar32 = (pointer)(local_128._0_8_ +
                                         local_e8 * (long)local_1e8 * local_128._16_8_);
                      local_1c8 = (pointer)(local_178.elemsize * (long)local_1d0);
                      pvVar22 = (void *)0x0;
                      do {
                        if (0 < (int)uVar1) {
                          uVar21 = 0;
                          do {
                            if (0 < (int)local_1a0) {
                              puVar27 = (undefined8 *)
                                        ((long)local_178.data +
                                        uVar21 * (long)iVar31 * 8 +
                                        (long)local_1c8 * (long)pvVar22 +
                                        local_178.cstep * (long)local_1e8 * local_178.elemsize);
                              iVar36 = 0;
                              do {
                                uVar19 = uVar40;
                                if (0 < iVar33) {
                                  do {
                                    *(undefined8 *)piVar32 = *puVar27;
                                    piVar32 = piVar32 + 2;
                                    puVar27 = puVar27 + iVar39;
                                    uVar26 = (int)uVar19 - 1;
                                    uVar19 = (ulong)uVar26;
                                  } while (uVar26 != 0);
                                }
                                puVar27 = puVar27 + (iVar17 - iVar33 * iVar39);
                                iVar36 = iVar36 + 1;
                              } while (iVar36 != (int)local_1a0);
                            }
                            uVar21 = uVar21 + 1;
                          } while (uVar21 != uVar1);
                        }
                        pvVar22 = (void *)((long)pvVar22 + 1);
                      } while (pvVar22 != local_1d8);
                    }
                    local_1e8 = (void *)((long)local_1e8 + 1);
                  } while (local_1e8 != (void *)uVar30);
                }
                im2col_sgemm_pack8to1_int8_sse
                          ((Mat *)local_128,&local_d8,local_1c0,
                           (Option *)local_180->workspace_allocator);
                if ((Allocator *)local_128._8_8_ != (Allocator *)0x0) {
                  LOCK();
                  *(int *)(_func_int ***)local_128._8_8_ =
                       *(int *)(_func_int ***)local_128._8_8_ + -1;
                  UNLOCK();
                  if (*(int *)(_func_int ***)local_128._8_8_ == 0) {
                    if (pAStack_108 == (Allocator *)0x0) {
LAB_001d979e:
                      if ((pointer)local_128._0_8_ != (pointer)0x0) {
                        free((void *)local_128._0_8_);
                      }
                    }
                    else {
                      (*pAStack_108->_vptr_Allocator[3])();
                    }
                  }
                }
              }
              else {
                local_190 = (Mat *)(ulong)(uint)local_d8.c;
                std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)local_128,(long)(int)uVar26,
                           &local_1d9);
                if (0 < (int)local_1d8) {
                  iVar15 = 0;
                  iVar18 = 0;
                  iVar20 = 0;
                  do {
                    if (0 < (int)uVar1) {
                      lVar34 = 0;
                      do {
                        *(int *)(local_128._0_8_ + (iVar15 + lVar34) * 4) = iVar18;
                        iVar18 = iVar18 + iVar31;
                        lVar34 = lVar34 + 1;
                      } while (uVar1 != (uint)lVar34);
                      iVar15 = iVar15 + (uint)lVar34;
                    }
                    iVar18 = iVar18 + ((int)local_1c8 * iVar36 - iVar31 * uVar1);
                    iVar20 = iVar20 + 1;
                  } while (iVar20 != (int)local_1d8);
                }
                if (0 < (int)local_190) {
                  local_1c0 = (Mat *)(long)iVar33;
                  local_130 = local_d8.data;
                  local_e0 = (Mat *)(local_d8.elemsize * local_d8.cstep);
                  local_1d8 = (void *)((ulong)(uVar26 - 1) * 8 + 8);
                  local_188 = 0;
                  do {
                    if (0 < (int)local_1a0) {
                      local_1c8 = (pointer)((long)local_e0 * local_188 + (long)local_d8.data);
                      local_1a8 = (void *)((local_1b8->weight_data_tm).cstep * local_188 *
                                           (local_1b8->weight_data_tm).elemsize +
                                          (long)(local_1b8->weight_data_tm).data);
                      local_1b0 = (pointer)0x0;
                      do {
                        if (0 < iVar33) {
                          local_1d0 = (void *)((long)local_1b0 * (long)local_198 *
                                              local_178.elemsize);
                          uVar21 = 0;
                          do {
                            if (iVar17 < 1) {
                              iVar31 = 0;
                            }
                            else {
                              uVar19 = 0;
                              iVar31 = 0;
                              pvVar22 = local_1a8;
                              do {
                                if (0 < (int)uVar26) {
                                  uVar41 = 0;
                                  do {
                                    auVar42._8_8_ = 0;
                                    auVar42._0_8_ =
                                         *(ulong *)((long)local_178.data +
                                                   (long)*(int *)(local_128._0_8_ + uVar41 * 4) * 8
                                                   + local_178.cstep * local_178.elemsize * uVar19 +
                                                     (long)local_178.w * (long)local_1d0 +
                                                     (long)(iVar39 * 8 * (int)uVar21));
                                    auVar44 = vpcmpgtb_avx((undefined1  [16])0x0,auVar42);
                                    auVar42 = vpunpcklbw_avx(auVar42,auVar44);
                                    auVar45._8_8_ = 0;
                                    auVar45._0_8_ = *(ulong *)((long)pvVar22 + uVar41 * 8);
                                    auVar44 = vpcmpgtb_avx((undefined1  [16])0x0,auVar45);
                                    auVar44 = vpunpcklbw_avx(auVar45,auVar44);
                                    auVar50 = vpmullw_avx(auVar44,auVar42);
                                    auVar44 = vpmulhw_avx(auVar42,auVar44);
                                    auVar42 = vpunpcklwd_avx(auVar50,auVar44);
                                    auVar44 = vpunpckhwd_avx(auVar50,auVar44);
                                    auVar44 = vpaddd_avx(auVar42,auVar44);
                                    auVar44 = vphaddd_avx(auVar44,auVar44);
                                    auVar44 = vphaddd_avx(auVar44,auVar44);
                                    iVar31 = iVar31 + auVar44._0_4_;
                                    uVar41 = uVar41 + 1;
                                  } while (uVar26 != uVar41);
                                  pvVar22 = (void *)((long)pvVar22 + (long)local_1d8);
                                }
                                uVar19 = uVar19 + 1;
                              } while (uVar19 != uVar30);
                            }
                            local_1c8[uVar21] = iVar31;
                            uVar21 = uVar21 + 1;
                          } while (uVar21 != uVar40);
                        }
                        local_1c8 = local_1c8 + (long)local_1c0;
                        local_1b0 = (pointer)((long)local_1b0 + 1);
                      } while (local_1b0 != (pointer)local_1a0);
                    }
                    local_188 = local_188 + 1;
                  } while ((Mat *)local_188 != local_190);
                }
LAB_001d9617:
                if ((pointer)local_128._0_8_ != (pointer)0x0) {
                  operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
                }
              }
            }
          }
        }
        else if (iVar39 == 1 && iVar31 == 1) {
          p_Var3 = local_1b8->_vptr_Convolution_x86_avx512[-3];
          uVar1 = *(uint *)(p_Var3 + 0x34 + (long)&(local_1b8->weight_winograd23_data).data);
          if (((ulong)uVar1 == 1) &&
             (*(int *)(p_Var3 + 0x38 + (long)&(local_1b8->weight_winograd23_data).data) == 1)) {
            if ((*(int *)(p_Var3 + 0x3c + (long)&(local_1b8->weight_winograd23_data).data) == 1) &&
               (((*(int *)(p_Var3 + 0x40 + (long)&(local_1b8->weight_winograd23_data).data) == 1 &&
                 (*(int *)(p_Var3 + 0x44 + (long)&(local_1b8->weight_winograd23_data).data) == 1))
                && (*(int *)(p_Var3 + (long)&(local_1b8->weight_winograd43_data).data) == 1)))) {
              conv1x1s1_sgemm_int8_sse(&local_178,&local_d8,&local_1b8->weight_sgemm_data,local_180)
              ;
            }
            else {
              if ((((*(int *)(p_Var3 + 0x3c + (long)&(local_1b8->weight_winograd23_data).data) != 1)
                   || (*(int *)(p_Var3 + 0x40 + (long)&(local_1b8->weight_winograd23_data).data) !=
                       1)) ||
                  (*(int *)(p_Var3 + 0x44 + (long)&(local_1b8->weight_winograd23_data).data) != 2))
                 || (*(int *)(p_Var3 + (long)&(local_1b8->weight_winograd43_data).data) != 2))
              goto LAB_001d907f;
              conv1x1s2_sgemm_int8_sse(&local_178,&local_d8,&local_1b8->weight_sgemm_data,local_180)
              ;
            }
          }
          else {
LAB_001d907f:
            if ((((local_180->use_winograd_convolution == true) && (uVar1 == 3)) &&
                ((local_180->use_winograd23_convolution != false &&
                 (((*(int *)(p_Var3 + 0x38 + (long)&(local_1b8->weight_winograd23_data).data) == 3
                   && (*(int *)(p_Var3 + 0x3c + (long)&(local_1b8->weight_winograd23_data).data) ==
                       1)) &&
                  (*(int *)(p_Var3 + 0x40 + (long)&(local_1b8->weight_winograd23_data).data) == 1)))
                 ))) && ((*(int *)(p_Var3 + 0x44 + (long)&(local_1b8->weight_winograd23_data).data)
                          == 1 && (*(int *)(p_Var3 + (long)&(local_1b8->weight_winograd43_data).data
                                           ) == 1)))) {
              if ((0xf < (int)local_198 * (int)local_188) &&
                 (0xf < *(int *)(p_Var3 + 0x30 + (long)&(local_1b8->weight_winograd23_data).data)))
              {
                conv3x3s1_winograd23_int8_sse
                          (&local_178,&local_d8,&local_1b8->weight_winograd23_data,local_180);
                goto LAB_001d962c;
              }
            }
            local_1a8 = (void *)(ulong)*(uint *)(p_Var3 + 0x38 +
                                                (long)&(local_1b8->weight_winograd23_data).data);
            iVar31 = *(int *)(p_Var3 + 0x3c + (long)&(local_1b8->weight_winograd23_data).data);
            local_188 = (long)*(int *)(p_Var3 + 0x40 +
                                      (long)&(local_1b8->weight_winograd23_data).data);
            iVar36 = *(int *)(p_Var3 + 0x44 + (long)&(local_1b8->weight_winograd23_data).data);
            lVar34 = (long)iVar36;
            local_198 = (void *)(long)*(int *)(p_Var3 + (long)&(local_1b8->weight_winograd43_data).
                                                               data);
            local_1d0 = (void *)CONCAT44(local_1d0._4_4_,local_178.w);
            pvVar22 = (void *)(ulong)(uint)local_178.c;
            lVar38 = (long)local_d8.w;
            puVar35 = (undefined1 *)(ulong)(uint)local_d8.h;
            iVar39 = *(uint *)(p_Var3 + 0x38 + (long)&(local_1b8->weight_winograd23_data).data) *
                     uVar1;
            local_1d8 = pvVar22;
            local_1a0 = puVar35;
            if (local_180->use_sgemm_convolution != true) {
              local_190 = (Mat *)(ulong)(uint)local_d8.c;
              local_1c8 = (pointer)CONCAT44(local_1c8._4_4_,iVar39);
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)local_128,(long)iVar39,&local_1d9);
              if (0 < (int)local_1a8) {
                iVar36 = 0;
                iVar15 = 0;
                iVar18 = 0;
                do {
                  if (0 < (int)uVar1) {
                    lVar28 = 0;
                    do {
                      *(int *)(local_128._0_8_ + (iVar36 + lVar28) * 4) = iVar18;
                      iVar18 = iVar18 + iVar31;
                      lVar28 = lVar28 + 1;
                    } while (uVar1 != (uint)lVar28);
                    iVar36 = iVar36 + (uint)lVar28;
                  }
                  iVar18 = iVar18 + ((int)local_1d0 * (int)local_188 - iVar31 * uVar1);
                  iVar15 = iVar15 + 1;
                } while (iVar15 != (int)local_1a8);
              }
              if (0 < (int)local_190) {
                local_130 = local_d8.data;
                local_e0 = (Mat *)(local_d8.elemsize * local_d8.cstep);
                local_80 = iVar17 * (int)local_1c8;
                local_188 = 0;
                do {
                  if (0 < (int)puVar35) {
                    local_1e8 = (void *)((long)local_e0 * local_188 + (long)local_d8.data);
                    local_1b0 = (pointer)((long)(local_80 * (int)local_188) +
                                         (long)(local_1b8->weight_data_tm).data);
                    local_1c0 = (Mat *)0x0;
                    do {
                      if (0 < iVar33) {
                        local_1d0 = local_178.data;
                        local_1a8 = (void *)((long)local_1c0 * (long)local_198 * local_178.elemsize)
                        ;
                        lVar28 = 0;
                        do {
                          if ((int)pvVar22 < 1) {
                            iVar31 = 0;
                          }
                          else {
                            pvVar16 = (void *)0x0;
                            iVar31 = 0;
                            piVar32 = local_1b0;
                            do {
                              if (0 < (int)local_1c8) {
                                uVar30 = 0;
                                do {
                                  iVar31 = iVar31 + (int)*(char *)((long)piVar32 + uVar30) *
                                                    (int)*(char *)((long)local_178.data +
                                                                  (long)*(int *)(local_128._0_8_ +
                                                                                uVar30 * 4) +
                                                                  local_178.cstep *
                                                                  local_178.elemsize * (long)pvVar16
                                                                  + (long)local_178.w *
                                                                    (long)local_1a8 +
                                                                    lVar28 * lVar34);
                                  uVar30 = uVar30 + 1;
                                } while (((ulong)local_1c8 & 0xffffffff) != uVar30);
                              }
                              piVar32 = (pointer)((long)piVar32 + (long)iVar39);
                              pvVar16 = (void *)((long)pvVar16 + 1);
                              pvVar22 = local_1d8;
                            } while (pvVar16 != local_1d8);
                          }
                          *(int *)((long)local_1e8 + lVar28 * 4) = iVar31;
                          lVar28 = lVar28 + 1;
                        } while (lVar28 != lVar38);
                      }
                      local_1e8 = (void *)((long)local_1e8 + lVar38 * 4);
                      local_1c0 = (Mat *)((long)&local_1c0->data + 1);
                      puVar35 = local_1a0;
                    } while (local_1c0 != (Mat *)local_1a0);
                  }
                  local_188 = local_188 + 1;
                } while ((Mat *)local_188 != local_190);
              }
              goto LAB_001d9617;
            }
            local_e8 = 0;
            local_128._0_28_ = ZEXT1228((undefined1  [12])0x0);
            _local_128 = ZEXT3260(local_128);
            _local_128 = (Option)CONCAT460(uVar13,_local_128);
            Mat::create((Mat *)local_128,local_d8.h * local_d8.w,iVar39,local_178.c,1,1,
                        local_180->workspace_allocator);
            local_190 = &local_1b8->weight_sgemm_data;
            if (0 < iVar17) {
              iVar17 = (int)local_1d0 * (int)local_198;
              local_198 = (void *)0x0;
              do {
                if (0 < (int)local_1a8) {
                  local_1b0 = (pointer)(local_178.cstep * (long)local_198 * local_178.elemsize +
                                       (long)local_178.data);
                  piVar32 = (pointer)(local_e8 * (long)local_198 * local_128._16_8_ +
                                     local_128._0_8_);
                  local_1c0 = (Mat *)((long)local_178.w * local_178.elemsize * local_188);
                  pvVar22 = (void *)0x0;
                  do {
                    local_1d0 = pvVar22;
                    if (0 < (int)uVar1) {
                      local_1c8 = (pointer)((long)local_1b0 + (long)local_1c0 * (long)local_1d0);
                      uVar30 = 0;
                      do {
                        if (0 < (int)puVar35) {
                          piVar23 = (pointer)((long)local_1c8 + uVar30 * (long)iVar31);
                          iVar39 = 0;
                          do {
                            if (iVar33 < 4) {
                              uVar26 = 0;
                            }
                            else {
                              iVar15 = 3;
                              do {
                                *(char *)piVar32 = (char)*piVar23;
                                *(undefined1 *)((long)piVar32 + 1) =
                                     *(undefined1 *)((long)piVar23 + lVar34);
                                *(undefined1 *)((long)piVar32 + 2) =
                                     *(undefined1 *)((long)piVar23 + (long)(iVar36 * 2));
                                *(undefined1 *)((long)piVar32 + 3) =
                                     *(undefined1 *)((long)piVar23 + (long)(iVar36 * 3));
                                piVar23 = piVar23 + lVar34;
                                piVar32 = piVar32 + 1;
                                iVar15 = iVar15 + 4;
                                uVar26 = iVar33 & 0xfffffffc;
                              } while (iVar15 < iVar33);
                            }
                            uVar14 = uVar26 | 1;
                            while ((int)uVar14 < iVar33) {
                              *(char *)piVar32 = (char)*piVar23;
                              *(undefined1 *)((long)piVar32 + 1) =
                                   *(undefined1 *)((long)piVar23 + lVar34);
                              piVar23 = (pointer)((long)piVar23 + (long)(iVar36 * 2));
                              piVar32 = (pointer)((long)piVar32 + 2);
                              uVar14 = uVar26 + 3;
                              uVar26 = uVar26 + 2;
                            }
                            if ((int)uVar26 < iVar33) {
                              iVar15 = iVar33 - uVar26;
                              do {
                                *(char *)piVar32 = (char)*piVar23;
                                piVar23 = (pointer)((long)piVar23 + lVar34);
                                piVar32 = (pointer)((long)piVar32 + 1);
                                iVar15 = iVar15 + -1;
                              } while (iVar15 != 0);
                            }
                            piVar23 = (pointer)((long)piVar23 + (long)(iVar17 - iVar33 * iVar36));
                            iVar39 = iVar39 + 1;
                            puVar35 = local_1a0;
                          } while (iVar39 != (int)local_1a0);
                        }
                        uVar30 = uVar30 + 1;
                      } while (uVar30 != uVar1);
                    }
                    pvVar22 = (void *)((long)local_1d0 + 1U);
                  } while ((void *)((long)local_1d0 + 1U) != local_1a8);
                }
                local_198 = (void *)((long)local_198 + 1);
              } while (local_198 != local_1d8);
            }
            im2col_sgemm_int8_sse
                      ((Mat *)local_128,&local_d8,local_190,(Option *)local_180->workspace_allocator
                      );
            if ((Allocator *)local_128._8_8_ != (Allocator *)0x0) {
              LOCK();
              *(int *)(_func_int ***)local_128._8_8_ = *(int *)(_func_int ***)local_128._8_8_ + -1;
              UNLOCK();
              if (*(int *)(_func_int ***)local_128._8_8_ == 0) {
                if (pAStack_108 == (Allocator *)0x0) goto LAB_001d979e;
                (*pAStack_108->_vptr_Allocator[3])();
              }
            }
          }
        }
      }
    }
LAB_001d962c:
    p_Var3 = local_1b8->_vptr_Convolution_x86_avx512[-3];
    if (local_7c < 0x65) {
      dequantize_from_int32
                (&local_d8,local_88,&local_1b8->scale_in_data,
                 (Mat *)(p_Var3 + 0x28 + (long)&(local_1b8->scale_in_data).data),local_180);
      pLVar4 = local_1b8->activation;
      iVar31 = 0;
      if (pLVar4 != (Layer *)0x0) {
        (*pLVar4->_vptr_Layer[9])(pLVar4,local_88,local_180);
      }
    }
    else {
      iVar31 = 0;
      requantize_from_int32_to_int8
                (&local_d8,local_88,&local_1b8->scale_in_data,
                 (Mat *)(&local_1b8->field_0x280 + (long)p_Var3),
                 (Mat *)(p_Var3 + 0x28 + (long)&(local_1b8->scale_in_data).data),
                 *(int *)(p_Var3 + 0x24 + (long)&(local_1b8->weight_winograd43_data).data),
                 (Mat *)(p_Var3 + 0x28 + (long)&(local_1b8->weight_winograd43_data).data),local_180)
      ;
    }
  }
  piVar2 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_d8.allocator == (Allocator *)0x0) {
        if (local_d8.data != (void *)0x0) {
          free(local_d8.data);
        }
      }
      else {
        (*(local_d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_001d9712:
  piVar2 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_178.allocator == (Allocator *)0x0) {
        if (local_178.data != (void *)0x0) {
          free(local_178.data);
        }
      }
      else {
        (*(local_178.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar31;
}

Assistant:

int Convolution_x86_avx512::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
    }

    //     NCNN_LOGE("Convolution_arm input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_arm %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    int out_elempack_int32 = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack_int32, (size_t)(4u * out_elempack_int32), out_elempack_int32, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

#if __SSE2__
    if (elempack == 8 && out_elempack_int32 == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (elempack == 1 && out_elempack_int32 == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 7 && kernel_h == 7 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv7x7s2_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (elempack == 8 && out_elempack_int32 == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack_int32 == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd23_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd23_data, opt);
            // conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (use_int8_requantize)
    {
        requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
    }
    else
    {
        dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }

    return 0;
}